

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O2

void __thiscall tcmalloc::PageHeap::MergeIntoFreeList(PageHeap *this,Span *span)

{
  uint64_t *puVar1;
  bool bVar2;
  Span *span_00;
  long lVar3;
  uint64_t uVar4;
  
  if (span->location != 0) {
    __assert_fail("span->location == Span::IN_USE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0xd0,"void tcmalloc::PageHeap::MergeIntoFreeList(Span *)");
  }
  uVar4 = span->npages;
  puVar1 = &(this->stat).in_used_bytes;
  *puVar1 = *puVar1 + uVar4 * -0x2000;
  span->location = 1;
  bVar2 = CheckSmallList(this);
  if (!bVar2) {
    __assert_fail("CheckSmallList()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0xd5,"void tcmalloc::PageHeap::MergeIntoFreeList(Span *)");
  }
  span_00 = MergePrevAndNextSpans(this,span);
  bVar2 = CheckSmallList(this);
  if (!bVar2) {
    __assert_fail("CheckSmallList()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0xd7,"void tcmalloc::PageHeap::MergeIntoFreeList(Span *)");
  }
  InsertToFreeList(this,span_00);
  bVar2 = CheckSmallList(this);
  if (bVar2) {
    lVar3 = this->release_rate_ - uVar4;
    this->release_rate_ = lVar3;
    if (lVar3 < 1) {
      uVar4 = ReleaseNormalSpans(this,1);
      lVar3 = 100;
      if (uVar4 != 0) {
        lVar3 = uVar4 * 100;
      }
      this->release_rate_ = lVar3;
    }
    bVar2 = CheckSmallList(this);
    if (bVar2) {
      return;
    }
    __assert_fail("CheckSmallList()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0xe5,"void tcmalloc::PageHeap::MergeIntoFreeList(Span *)");
  }
  __assert_fail("CheckSmallList()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                ,0xd9,"void tcmalloc::PageHeap::MergeIntoFreeList(Span *)");
}

Assistant:

void MergeIntoFreeList(Span* span) {
        uint64_t old_npages = span->npages;
        assert(span->location == Span::IN_USE);
        stat.in_used_bytes -= span->npages * spanPageSize;
        span->location = Span::IN_NORMAL;

        // 尝试合并相邻span
        assert(CheckSmallList());
        span = MergePrevAndNextSpans(span);
        assert(CheckSmallList());
        InsertToFreeList(span);
        assert(CheckSmallList());

        // 检查是否需要释放normal状态的span
        release_rate_ -= old_npages;
        if (release_rate_ <= 0) {
            uint64_t released_pages = ReleaseNormalSpans(1);
            if (released_pages > 0) {
                release_rate_ = released_pages * 100;
            } else {
                release_rate_ = 100;
            }
        }
        assert(CheckSmallList());
    }